

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

void SQSharedState::MarkObject(SQObjectPtr *o,SQCollectable_conflict **chain)

{
  SQObjectType SVar1;
  
  SVar1 = (o->super_SQObject)._type;
  if ((int)SVar1 < 0x8002000) {
    if ((int)SVar1 < 0x8000200) {
      if ((SVar1 == OT_ARRAY) || (SVar1 == OT_CLOSURE)) goto LAB_0012007a;
    }
    else if ((SVar1 == OT_NATIVECLOSURE) || ((SVar1 == OT_GENERATOR || (SVar1 == OT_THREAD))))
    goto LAB_0012007a;
  }
  else if ((int)SVar1 < 0xa000020) {
    if (((SVar1 == OT_FUNCPROTO) || (SVar1 == OT_CLASS)) || (SVar1 == OT_OUTER)) {
LAB_0012007a:
      (*(((o->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
        super_SQRefCounted._vptr_SQRefCounted[4])();
      return;
    }
  }
  else if (((SVar1 == OT_INSTANCE) || (SVar1 == OT_USERDATA)) || (SVar1 == OT_TABLE))
  goto LAB_0012007a;
  return;
}

Assistant:

void SQSharedState::MarkObject(SQObjectPtr &o,SQCollectable **chain)
{
    switch(sq_type(o)){
    case OT_TABLE:_table(o)->Mark(chain);break;
    case OT_ARRAY:_array(o)->Mark(chain);break;
    case OT_USERDATA:_userdata(o)->Mark(chain);break;
    case OT_CLOSURE:_closure(o)->Mark(chain);break;
    case OT_NATIVECLOSURE:_nativeclosure(o)->Mark(chain);break;
    case OT_GENERATOR:_generator(o)->Mark(chain);break;
    case OT_THREAD:_thread(o)->Mark(chain);break;
    case OT_CLASS:_class(o)->Mark(chain);break;
    case OT_INSTANCE:_instance(o)->Mark(chain);break;
    case OT_OUTER:_outer(o)->Mark(chain);break;
    case OT_FUNCPROTO:_funcproto(o)->Mark(chain);break;
    default: break; //shutup compiler
    }
}